

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

int splittingStep_SetOrder(ARKodeMem ark_mem,int order)

{
  int iVar1;
  int iVar2;
  ARKodeSplittingStepMem step_mem;
  
  step_mem = (ARKodeSplittingStepMem)0x0;
  iVar2 = splittingStep_AccessStepMem(ark_mem,"splittingStep_SetOrder",&step_mem);
  if (iVar2 == 0) {
    iVar1 = 1;
    if (1 < order) {
      iVar1 = order;
    }
    step_mem->order = iVar1;
    SplittingStepCoefficients_Destroy(&step_mem->coefficients);
  }
  return iVar2;
}

Assistant:

static int splittingStep_SetOrder(ARKodeMem ark_mem, int order)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  /* set user-provided value, or default, depending on argument */
  step_mem->order = SUNMAX(1, order);

  SplittingStepCoefficients_Destroy(&step_mem->coefficients);

  return ARK_SUCCESS;
}